

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.c
# Opt level: O0

int mbedtls_pk_encrypt(mbedtls_pk_context *ctx,uchar *input,size_t ilen,uchar *output,size_t *olen,
                      size_t osize,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  size_t osize_local;
  size_t *olen_local;
  uchar *output_local;
  size_t ilen_local;
  uchar *input_local;
  mbedtls_pk_context *ctx_local;
  
  if ((ctx == (mbedtls_pk_context *)0x0) || (ctx->pk_info == (mbedtls_pk_info_t *)0x0)) {
    ctx_local._4_4_ = -16000;
  }
  else if (ctx->pk_info->encrypt_func ==
           (_func_int_void_ptr_uchar_ptr_size_t_uchar_ptr_size_t_ptr_size_t__func_int_void_ptr_uchar_ptr_size_t_ptr_void_ptr
            *)0x0) {
    ctx_local._4_4_ = -0x3f00;
  }
  else {
    ctx_local._4_4_ =
         (*ctx->pk_info->encrypt_func)(ctx->pk_ctx,input,ilen,output,olen,osize,f_rng,p_rng);
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_pk_encrypt( mbedtls_pk_context *ctx,
                const unsigned char *input, size_t ilen,
                unsigned char *output, size_t *olen, size_t osize,
                int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    if( ctx == NULL || ctx->pk_info == NULL )
        return( MBEDTLS_ERR_PK_BAD_INPUT_DATA );

    if( ctx->pk_info->encrypt_func == NULL )
        return( MBEDTLS_ERR_PK_TYPE_MISMATCH );

    return( ctx->pk_info->encrypt_func( ctx->pk_ctx, input, ilen,
                output, olen, osize, f_rng, p_rng ) );
}